

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::bin_writer<1>_>
          *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  char __tmp;
  size_t __len_1;
  ulong uVar5;
  ulong uVar6;
  size_t __len;
  size_t __n;
  char *pcVar7;
  char *local_38;
  
  uVar6 = (ulong)(uint)specs->width;
  uVar5 = f->size_;
  __n = uVar6 - uVar5;
  if (uVar6 < uVar5 || __n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar5 = uVar5 + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    local_38 = (char *)(lVar3 + puVar2[1]);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
                  *)f,&local_38);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar6 = uVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    local_38 = (char *)(lVar3 + puVar2[1]);
    bVar1 = (specs->fill).data_[0];
    bVar4 = specs->field_0x9 & 0xf;
    if (bVar4 == 3) {
      uVar5 = __n >> 1;
      pcVar7 = local_38;
      if (1 < __n) {
        pcVar7 = local_38 + uVar5;
        memset(local_38,(uint)bVar1,uVar5);
      }
      local_38 = pcVar7;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
                    *)f,&local_38);
      __n = __n - uVar5;
    }
    else {
      if (bVar4 == 2) {
        pcVar7 = local_38 + __n;
        memset(local_38,(uint)bVar1,__n);
        local_38 = pcVar7;
        padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
        ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
                      *)f,&local_38);
        return;
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
                    *)f,&local_38);
    }
    memset(local_38,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }